

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_param.cc
# Opt level: O0

void __thiscall ParamField::GenInitCode(ParamField *this,Output *out_cc,Env *env)

{
  char *pcVar1;
  char *pcVar2;
  Env *in_RDX;
  Output *in_RSI;
  Field *in_RDI;
  bool in_stack_00000027;
  ID *in_stack_00000028;
  ID *in_stack_ffffffffffffffb8;
  
  Field::id(in_RDI);
  pcVar1 = Env::LValue(in_RDX,in_stack_ffffffffffffffb8);
  Field::id(in_RDI);
  pcVar2 = ID::Name((ID *)0x1439ea);
  Output::println(in_RSI,"%s = %s;",pcVar1,pcVar2);
  Field::id(in_RDI);
  Env::SetEvaluated(env,in_stack_00000028,in_stack_00000027);
  return;
}

Assistant:

void ParamField::GenInitCode(Output* out_cc, Env* env)
	{
	out_cc->println("%s = %s;", env->LValue(id()), id()->Name());
	env->SetEvaluated(id());
	}